

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O3

void __thiscall slang::ast::SystemTimingCheckSymbol::resolve(SystemTimingCheckSymbol *this)

{
  SyntaxKind SVar1;
  Scope *pSVar2;
  Compilation *pCVar3;
  SyntaxNode *pSVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar5;
  Type *pTVar6;
  SyntaxNode *this_00;
  logic_t lVar7;
  int iVar8;
  byte *pbVar9;
  Diagnostic *pDVar10;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar11;
  Expression *pEVar12;
  undefined4 extraout_var_00;
  size_t __n;
  size_t __n_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SourceLocation SVar13;
  undefined4 extraout_var_03;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar14;
  variant_alternative_t<2UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar15;
  variant_alternative_t<3UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar16;
  EVP_PKEY_CTX *pEVar17;
  ulong uVar18;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  Info *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  EVP_PKEY_CTX *extraout_RDX_11;
  EVP_PKEY_CTX *extraout_RDX_12;
  EVP_PKEY_CTX *extraout_RDX_13;
  EVP_PKEY_CTX *extraout_RDX_14;
  EVP_PKEY_CTX *extraout_RDX_15;
  EVP_PKEY_CTX *extraout_RDX_16;
  long lVar19;
  SystemTimingCheckDef *pSVar20;
  DiagCode code;
  SyntaxNode *pSVar21;
  pointer pSVar22;
  LookupLocation LVar23;
  SourceRange SVar24;
  string_view sVar25;
  string_view sVar26;
  TimingCheckEventArgSyntax *eventArg;
  EdgeDescriptor desc;
  EdgeKind edge;
  SmallVector<std::array<char,_2UL>,_20UL> edgeDescriptors;
  ASTContext context;
  Expression *condition;
  SmallVector<slang::ast::SystemTimingCheckSymbol::Arg,_2UL> argBuf;
  Token local_180;
  SystemTimingCheckSymbol *local_170;
  Compilation *local_168;
  EdgeKind local_15c;
  undefined1 local_158 [24];
  array<char,_2UL> aaStack_140 [4];
  TempVarSymbol *local_138;
  RandomizeDetails *pRStack_130;
  AssertionInstanceDetails *local_128;
  ASTContext local_118;
  Scope *local_e0;
  SyntaxNode *local_d8;
  ulong local_d0;
  Expression *local_c8;
  Token *local_c0;
  SystemTimingCheckDef *local_b8;
  SyntaxNode *local_b0;
  pointer local_a8;
  Expression *local_a0;
  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> local_98;
  
  this->isResolved = true;
  if (this->def != (SystemTimingCheckDef *)0x0) {
    pSVar2 = (this->super_Symbol).parentScope;
    pSVar21 = (this->super_Symbol).originatingSyntax;
    pCVar3 = pSVar2->compilation;
    local_e0 = pSVar2->thisSym->parentScope;
    LVar23 = LookupLocation::after(&this->super_Symbol);
    local_118.lookupIndex = LVar23.index;
    local_118.flags.m_bits = 0x400000020;
    local_118.instanceOrProc = (Symbol *)0x0;
    local_118.firstTempVar = (TempVarSymbol *)0x0;
    local_118.randomizeDetails = (RandomizeDetails *)0x0;
    local_118.assertionInstance = (AssertionInstanceDetails *)0x0;
    pSVar20 = this->def;
    pbVar9 = (byte *)((long)&(pSVar21[6].previewNode)->kind + 1);
    pEVar17 = (EVP_PKEY_CTX *)((ulong)pbVar9 >> 1);
    local_118.scope.ptr = pSVar2;
    if (pEVar17 < (EVP_PKEY_CTX *)pSVar20->minArgs) {
      SVar24 = slang::syntax::SyntaxNode::sourceRange(pSVar21);
      pDVar10 = ASTContext::addDiag(&local_118,(DiagCode)0x9f0007,SVar24);
      sVar25 = parsing::Token::valueText((Token *)&pSVar21[3].parent);
      Diagnostic::operator<<(pDVar10,sVar25);
      local_98.data_ = (pointer)this->def->minArgs;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar10->args,(unsigned_long *)&local_98);
      pSVar21 = pSVar21[6].previewNode;
    }
    else {
      src = (EVP_PKEY_CTX *)
            ((long)(pSVar20->args).
                   super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar20->args).
                   super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
      if (pEVar17 <= src) {
        local_98.data_ = (pointer)local_98.firstElement;
        local_98.len = 0;
        local_98.cap = 2;
        local_168 = pCVar3;
        if ((byte *)0x1 < pbVar9) {
          local_c0 = (Token *)&pSVar21[3].parent;
          uVar18 = 0;
          local_170 = this;
          local_b8 = pSVar20;
          local_b0 = pSVar21;
          do {
            pSVar22 = (pSVar20->args).
                      super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar18;
            local_d0 = uVar18;
            ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)(pSVar21[6].parent + uVar18 * 2));
            pSVar4 = *ppSVar11;
            SVar1 = pSVar4->kind;
            if (SVar1 == TimingCheckEventArg) {
              if (pSVar22->kind == Event) {
LAB_0023dbc2:
                pEVar12 = bindTerminal(*(ExpressionSyntax **)(pSVar4 + 2),Both,local_e0,&local_118);
                local_c8 = (Expression *)0x0;
                if (pSVar4[2].parent != (SyntaxNode *)0x0) {
                  iVar8 = Expression::bind((int)pSVar4[2].parent[1].previewNode,
                                           (sockaddr *)&local_118,0);
                  local_c8 = (Expression *)CONCAT44(extraout_var_00,iVar8);
                  ASTContext::requireBooleanConvertible(&local_118,local_c8);
                }
                local_a8 = pSVar22;
                local_a0 = pEVar12;
                local_15c = SemanticFacts::getEdgeKind((TokenKind)pSVar4[1].kind);
                local_158._8_8_ = 0;
                local_158._0_8_ = aaStack_140;
                local_158._16_8_ = 0x14;
                local_d8 = pSVar4[1].previewNode;
                pEVar17 = extraout_RDX_03;
                if ((local_d8 != (SyntaxNode *)0x0) &&
                   (pbVar9 = (byte *)((long)&(local_d8[3].previewNode)->kind + 1),
                   (byte *)0x1 < pbVar9)) {
                  uVar18 = (ulong)pbVar9 >> 1;
                  lVar19 = 0;
                  do {
                    ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                           *)((long)&(local_d8[3].parent)->kind + lVar19));
                    pSVar5 = *ppSVar11;
                    sVar25 = parsing::Token::rawText((Token *)(pSVar5 + 1));
                    __n = sVar25._M_len;
                    sVar26 = parsing::Token::rawText((Token *)&pSVar5[1].previewNode);
                    pEVar17 = (EVP_PKEY_CTX *)sVar26._M_str;
                    __n_00 = sVar26._M_len;
                    if (__n_00 + __n == 2) {
                      memcpy(&local_180,sVar25._M_str,__n);
                      if (__n_00 != 0) {
                        memcpy((void *)((long)&local_180.kind + __n),pEVar17,__n_00);
                      }
                      SmallVectorBase<std::array<char,2ul>>::
                      emplace_back<std::array<char,2ul>const&>
                                ((SmallVectorBase<std::array<char,2ul>> *)local_158,
                                 (array<char,_2UL> *)&local_180);
                      pEVar17 = extraout_RDX_04;
                    }
                    lVar19 = lVar19 + 0x30;
                    uVar18 = uVar18 - 1;
                  } while (uVar18 != 0);
                }
                iVar8 = SmallVectorBase<std::array<char,_2UL>_>::copy
                                  ((SmallVectorBase<std::array<char,_2UL>_> *)local_158,
                                   (EVP_PKEY_CTX *)local_168,pEVar17);
                local_180.rawLen = extraout_var_01;
                local_180.kind = (short)iVar8;
                local_180._2_1_ = (char)((uint)iVar8 >> 0x10);
                local_180.numFlags.raw = (char)((uint)iVar8 >> 0x18);
                local_180.info = extraout_RDX_05;
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                emplace_back<slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::EdgeKind&,std::span<std::array<char,2ul>,18446744073709551615ul>>
                          (&local_98,local_a0,&local_c8,&local_15c,
                           (span<std::array<char,_2UL>,_18446744073709551615UL> *)&local_180);
                pSVar22 = local_a8;
                pSVar21 = local_b0;
                pSVar20 = local_b8;
                this = local_170;
                src = extraout_RDX_06;
                if ((array<char,_2UL> *)local_158._0_8_ != aaStack_140) {
                  operator_delete((void *)local_158._0_8_);
                  src = extraout_RDX_07;
                }
LAB_0023dd81:
                if (pSVar22->requireEdge == true) {
                  src = (EVP_PKEY_CTX *)(local_98.len * 5);
                  if (local_98.data_[local_98.len - 1].expr != (Expression *)0x0) {
                    if (local_98.data_[local_98.len - 1].edge == None) {
                      pDVar10 = ASTContext::addDiag(&local_118,(DiagCode)0xc50006,
                                                    (local_98.data_[local_98.len - 1].expr)->
                                                    sourceRange);
                      sVar25 = parsing::Token::valueText(local_c0);
                      Diagnostic::operator<<(pDVar10,sVar25);
                      src = extraout_RDX_14;
                    }
                    else if ((local_98.data_[local_98.len - 1].edge == BothEdges) &&
                            (this->def->kind == NoChange)) {
                      SVar24 = parsing::Token::range((Token *)(pSVar4 + 1));
                      ASTContext::addDiag(&local_118,(DiagCode)0x8a0006,SVar24);
                      src = extraout_RDX_08;
                    }
                  }
                }
                goto switchD_0023db7c_default;
              }
              SVar24 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
              code.subsystem = Declarations;
              code.code = 0xc6;
LAB_0023db24:
              ASTContext::addDiag(&local_118,code,SVar24);
LAB_0023db31:
              SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>(&local_98);
              src = extraout_RDX_01;
            }
            else {
              if (SVar1 == EmptyTimingCheckArg) {
                if (local_d0 < this->def->minArgs) {
                  ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         *)(pSVar21[6].parent + uVar18 * 2));
                  SVar24 = slang::syntax::SyntaxNode::sourceRange(*ppSVar11);
                  code.subsystem = Expressions;
                  code.code = 0x4d;
                  goto LAB_0023db24;
                }
                goto LAB_0023db31;
              }
              src = extraout_RDX_00;
              switch(pSVar22->kind) {
              case Event:
                if (SVar1 != ExpressionTimingCheckArg) goto LAB_0023dbc2;
                pEVar12 = bindTerminal(*(ExpressionSyntax **)(pSVar4 + 1),Both,local_e0,&local_118);
                if (pEVar12 == (Expression *)0x0) {
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                            (&local_98);
                  src = extraout_RDX_16;
                }
                else {
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                  emplace_back<slang::ast::Expression_const&>(&local_98,pEVar12);
                  src = extraout_RDX_02;
                }
                goto LAB_0023dd81;
              case Notifier:
                this_00 = *(SyntaxNode **)(pSVar4 + 1);
                if (this_00->kind == IdentifierName) {
                  local_158._12_4_ = local_118._12_4_;
                  local_158._8_4_ = local_118.lookupIndex;
                  aaStack_140 = (array<char,_2UL>  [4])local_118.instanceOrProc;
                  local_128 = local_118.assertionInstance;
                  local_138 = local_118.firstTempVar;
                  pRStack_130 = local_118.randomizeDetails;
                  local_158._0_8_ = local_118.scope.ptr;
                  local_158._16_8_ = local_118.flags.m_bits & 0x1fffffffffdf;
                  pTVar6 = local_168->logicType;
                  local_180 = slang::syntax::SyntaxNode::getFirstToken(this_00);
                  SVar13 = parsing::Token::location(&local_180);
                  pEVar12 = Expression::bindLValue
                                      ((ExpressionSyntax *)this_00,pTVar6,SVar13,
                                       (ASTContext *)local_158,false);
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                  emplace_back<slang::ast::Expression_const&>(&local_98,pEVar12);
                  src = extraout_RDX_12;
                  this = local_170;
                }
                else {
                  SVar24 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
                  this = local_170;
                  ASTContext::addDiag(&local_118,(DiagCode)0x680006,SVar24);
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                            (&local_98);
                  src = extraout_RDX_13;
                }
                break;
              case DelayedRef:
                if (local_98.data_[pSVar22->signalRef].expr == (Expression *)0x0) {
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                            (&local_98);
                  src = extraout_RDX_15;
                }
                else {
                  pSVar4 = *(SyntaxNode **)(pSVar4 + 1);
                  pTVar6 = ((local_98.data_[pSVar22->signalRef].expr)->type).ptr;
                  local_158._0_16_ =
                       (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(pSVar4);
                  SVar13 = parsing::Token::location((Token *)local_158);
                  pEVar12 = Expression::bindLValue
                                      ((ExpressionSyntax *)pSVar4,pTVar6,SVar13,&local_118,false);
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                  emplace_back<slang::ast::Expression_const&>(&local_98,pEVar12);
                  src = extraout_RDX_10;
                }
                break;
              case Limit:
                iVar8 = Expression::bind((int)*(undefined8 *)(pSVar4 + 1),(sockaddr *)&local_118,0);
                pEVar12 = (Expression *)CONCAT44(extraout_var_03,iVar8);
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                emplace_back<slang::ast::Expression_const&>(&local_98,pEVar12);
                ASTContext::eval((ConstantValue *)local_158,&local_118,pEVar12,
                                 (bitmask<slang::ast::EvalFlags>)0x0);
                if (((__index_type)local_138 != '\0') && (pSVar22->requirePositive == true)) {
                  if (((__index_type)local_138 == '\x01') &&
                     (pvVar14 = std::
                                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                          ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                            *)local_158),
                     (pvVar14->super_SVIntStorage).signFlag == true)) {
                    pvVar14 = std::
                              get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                        ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                          *)local_158);
                    lVar7 = SVInt::operator[](pvVar14,(pvVar14->super_SVIntStorage).bitWidth - 1);
                    if (((lVar7.value == '\0') || (lVar7.value == 0x80)) || (lVar7.value == '@'))
                    goto LAB_0023df3d;
                  }
                  else {
LAB_0023df3d:
                    if ((__index_type)local_138 == '\x02') {
                      pvVar15 = std::
                                get<2ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                          ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                            *)local_158);
                      if (pvVar15->v <= 0.0 && pvVar15->v != 0.0) goto LAB_0023df74;
                    }
                    if (((__index_type)local_138 != '\x03') ||
                       (pvVar16 = std::
                                  get<3ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                            ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                              *)local_158), 0.0 < pvVar16->v || pvVar16->v == 0.0))
                    goto LAB_0023df98;
                  }
LAB_0023df74:
                  pDVar10 = ASTContext::addDiag(&local_118,(DiagCode)0xca0007,pEVar12->sourceRange);
                  Diagnostic::operator<<(pDVar10,(ConstantValue *)local_158);
                }
LAB_0023df98:
                std::__detail::__variant::
                _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                     *)local_158);
                src = extraout_RDX_11;
                break;
              case Condition:
                iVar8 = Expression::bind((int)*(undefined8 *)(pSVar4 + 1),(sockaddr *)&local_118,0);
                ASTContext::requireBooleanConvertible
                          (&local_118,(Expression *)CONCAT44(extraout_var_02,iVar8));
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                emplace_back<slang::ast::Expression_const&>
                          (&local_98,(Expression *)CONCAT44(extraout_var_02,iVar8));
                src = extraout_RDX_09;
              }
            }
switchD_0023db7c_default:
            uVar18 = local_d0 + 1;
          } while (uVar18 < (ulong)((long)&(pSVar21[6].previewNode)->kind + 1) >> 1);
        }
        iVar8 = SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::copy
                          (&local_98,(EVP_PKEY_CTX *)local_168,src);
        (this->args)._M_ptr = (pointer)CONCAT44(extraout_var,iVar8);
        (this->args)._M_extent._M_extent_value = extraout_RDX;
        if (local_98.data_ == (pointer)local_98.firstElement) {
          return;
        }
        operator_delete(local_98.data_);
        return;
      }
      SVar24 = slang::syntax::SyntaxNode::sourceRange(pSVar21);
      pDVar10 = ASTContext::addDiag(&local_118,(DiagCode)0xa00007,SVar24);
      sVar25 = parsing::Token::valueText((Token *)&pSVar21[3].parent);
      Diagnostic::operator<<(pDVar10,sVar25);
      local_98.data_ =
           (pointer)((long)(pSVar20->args).
                           super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pSVar20->args).
                           super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar10->args,(unsigned_long *)&local_98);
      pSVar21 = pSVar21[6].previewNode;
    }
    local_98.data_ = (pointer)((ulong)((long)&pSVar21->kind + 1) >> 1);
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar10->args,(unsigned_long *)&local_98);
  }
  return;
}

Assistant:

void SystemTimingCheckSymbol::resolve() const {
    isResolved = true;
    if (!def)
        return;

    auto syntaxPtr = getSyntax();
    auto parent = getParentScope();
    SLANG_ASSERT(syntaxPtr && parent);

    auto parentParent = parent->asSymbol().getParentScope();
    auto& comp = parent->getCompilation();
    ASTContext context(*parent, LookupLocation::after(*this),
                       ASTFlags::NonProcedural | ASTFlags::SpecifyBlock);

    auto& syntax = syntaxPtr->as<SystemTimingCheckSyntax>();
    auto& actualArgs = syntax.args;
    auto& formalArgs = def->args;

    if (actualArgs.size() < def->minArgs) {
        auto& diag = context.addDiag(diag::TooFewArguments, syntax.sourceRange());
        diag << syntax.name.valueText();
        diag << def->minArgs << actualArgs.size();
        return;
    }

    if (actualArgs.size() > formalArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, syntax.sourceRange());
        diag << syntax.name.valueText();
        diag << formalArgs.size();
        diag << actualArgs.size();
        return;
    }

    SmallVector<Arg> argBuf;
    for (size_t i = 0; i < actualArgs.size(); i++) {
        auto& formal = formalArgs[i];
        auto& actual = *actualArgs[i];
        if (actual.kind == SyntaxKind::EmptyTimingCheckArg) {
            if (i < def->minArgs)
                context.addDiag(diag::EmptyArgNotAllowed, actualArgs[i]->sourceRange());
            argBuf.emplace_back();
            continue;
        }

        if (actual.kind == SyntaxKind::TimingCheckEventArg &&
            formal.kind != SystemTimingCheckArgDef::Event) {
            context.addDiag(diag::TimingCheckEventNotAllowed, actual.sourceRange());
            argBuf.emplace_back();
            continue;
        }

        switch (formal.kind) {
            case SystemTimingCheckArgDef::Limit: {
                auto& expr = Expression::bind(*actual.as<ExpressionTimingCheckArgSyntax>().expr,
                                              context);
                argBuf.emplace_back(expr);

                auto val = context.eval(expr);
                if (val && formal.requirePositive) {
                    if ((val.isInteger() && val.integer().isSigned() &&
                         val.integer().isNegative()) ||
                        (val.isReal() && val.real() < 0.0) ||
                        (val.isShortReal() && val.shortReal() < 0.0f)) {
                        context.addDiag(diag::NegativeTimingLimit, expr.sourceRange) << val;
                    }
                }
                break;
            }
            case SystemTimingCheckArgDef::Condition: {
                auto& expr = Expression::bind(*actual.as<ExpressionTimingCheckArgSyntax>().expr,
                                              context);
                context.requireBooleanConvertible(expr);
                argBuf.emplace_back(expr);
                break;
            }
            case SystemTimingCheckArgDef::Notifier: {
                // Needs to be a simple identifier, referencing an integral lvalue
                auto& exprSyntax = *actual.as<ExpressionTimingCheckArgSyntax>().expr;
                if (exprSyntax.kind != SyntaxKind::IdentifierName) {
                    context.addDiag(diag::InvalidTimingCheckNotifierArg, actual.sourceRange());
                    argBuf.emplace_back();
                    break;
                }

                ASTContext nonContinuous = context;
                nonContinuous.flags &= ~ASTFlags::NonProcedural;

                auto& expr = Expression::bindLValue(exprSyntax, comp.getLogicType(),
                                                    exprSyntax.getFirstToken().location(),
                                                    nonContinuous, /* isInout */ false);
                argBuf.emplace_back(expr);
                break;
            }
            case SystemTimingCheckArgDef::Event:
                if (actual.kind == SyntaxKind::ExpressionTimingCheckArg) {
                    auto expr = bindTerminal(*actual.as<ExpressionTimingCheckArgSyntax>().expr,
                                             SpecifyBlockSymbol::SpecifyTerminalDir::Both,
                                             parentParent, context);
                    if (!expr)
                        argBuf.emplace_back();
                    else
                        argBuf.emplace_back(*expr);
                }
                else {
                    auto& eventArg = actual.as<TimingCheckEventArgSyntax>();
                    auto expr = bindTerminal(*eventArg.terminal,
                                             SpecifyBlockSymbol::SpecifyTerminalDir::Both,
                                             parentParent, context);

                    const Expression* condition = nullptr;
                    if (eventArg.condition) {
                        condition = &Expression::bind(*eventArg.condition->expr, context);
                        context.requireBooleanConvertible(*condition);
                    }

                    auto edge = SemanticFacts::getEdgeKind(eventArg.edge.kind);

                    SmallVector<EdgeDescriptor> edgeDescriptors;
                    if (eventArg.controlSpecifier) {
                        for (auto descSyntax : eventArg.controlSpecifier->descriptors) {
                            auto t1 = descSyntax->t1.rawText();
                            auto t2 = descSyntax->t2.rawText();
                            if (t1.length() + t2.length() != 2)
                                continue;

                            EdgeDescriptor desc;
                            memcpy(desc.data(), t1.data(), t1.length());
                            if (!t2.empty())
                                memcpy(desc.data() + t1.length(), t2.data(), t2.length());

                            edgeDescriptors.push_back(desc);
                        }
                    }

                    argBuf.emplace_back(*expr, condition, edge, edgeDescriptors.copy(comp));
                }

                if (formal.requireEdge && argBuf.back().expr) {
                    auto edge = argBuf.back().edge;
                    if (edge == EdgeKind::None) {
                        context.addDiag(diag::TimingCheckEventEdgeRequired,
                                        argBuf.back().expr->sourceRange)
                            << syntax.name.valueText();
                    }
                    else if (def->kind == SystemTimingCheckKind::NoChange &&
                             edge == EdgeKind::BothEdges) {
                        context.addDiag(diag::NoChangeEdgeRequired,
                                        actual.as<TimingCheckEventArgSyntax>().edge.range());
                    }
                }
                break;
            case SystemTimingCheckArgDef::DelayedRef: {
                SLANG_ASSERT(formal.signalRef >= 0 && formal.signalRef < int(i));
                auto signalExpr = argBuf[size_t(formal.signalRef)].expr;
                if (!signalExpr) {
                    argBuf.emplace_back();
                    break;
                }

                auto& exprSyntax = *actual.as<ExpressionTimingCheckArgSyntax>().expr;
                auto& expr = Expression::bindLValue(exprSyntax, *signalExpr->type,
                                                    exprSyntax.getFirstToken().location(), context,
                                                    /* isInout */ false);
                argBuf.emplace_back(expr);
                break;
            }
        }
    }

    args = argBuf.copy(comp);
}